

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O3

void __thiscall FIX::DataDictionary::setVersion(DataDictionary *this,string *beginString)

{
  pointer pcVar1;
  undefined1 local_68 [16];
  _Alloc_hider local_58;
  char local_48 [16];
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  field_metrics local_18;
  
  local_68._0_8_ = &PTR__FieldBase_001f55c8;
  local_68._8_4_ = 8;
  local_58._M_p = local_48;
  pcVar1 = (beginString->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + beginString->_M_string_length);
  local_38._M_p = (pointer)&local_28;
  local_30 = 0;
  local_28._M_local_buf[0] = '\0';
  local_18.m_length = 0;
  local_18.m_checksum = 0;
  local_68._0_8_ = &PTR__FieldBase_001f5568;
  (this->m_beginString).super_StringField.super_FieldBase.m_tag = local_68._8_4_;
  std::__cxx11::string::_M_assign
            ((string *)&(this->m_beginString).super_StringField.super_FieldBase.m_string);
  (this->m_beginString).super_StringField.super_FieldBase.m_metrics = local_18;
  (this->m_beginString).super_StringField.super_FieldBase.m_data._M_string_length = 0;
  *(this->m_beginString).super_StringField.super_FieldBase.m_data._M_dataplus._M_p = '\0';
  FieldBase::~FieldBase((FieldBase *)local_68);
  this->m_hasVersion = true;
  return;
}

Assistant:

void setVersion(const std::string &beginString) {
    m_beginString = beginString;
    m_hasVersion = true;
  }